

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

void __thiscall Constructor::printBody(Constructor *this,ostream *s,ParserWalker *walker)

{
  int i;
  TripleSymbol *pTVar1;
  pointer pbVar2;
  char *pcVar3;
  OperandSymbol *pOVar4;
  long lVar5;
  ulong uVar6;
  
  i = this->flowthruindex;
  if ((((long)i == -1) ||
      (pTVar1 = (this->operands).
                super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>._M_impl.
                super__Vector_impl_data._M_start[i]->triple, pTVar1 == (TripleSymbol *)0x0)) ||
     (lVar5 = __dynamic_cast(pTVar1,&TripleSymbol::typeinfo,&SubtableSymbol::typeinfo,0), lVar5 == 0
     )) {
    if (this->firstwhitespace != -1) {
      uVar6 = (ulong)this->firstwhitespace;
      lVar5 = uVar6 << 5;
      while( true ) {
        uVar6 = uVar6 + 1;
        pbVar2 = (this->printpiece).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->printpiece).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <= uVar6)
        break;
        pcVar3 = *(char **)((long)&pbVar2[1]._M_dataplus._M_p + lVar5);
        if (*pcVar3 == '\n') {
          pOVar4 = (this->operands).
                   super__Vector_base<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)pcVar3[1] + -0x41];
          (**(code **)(*(long *)&(pOVar4->super_SpecificSymbol).super_TripleSymbol.
                                 super_SleighSymbol + 0x50))(pOVar4,s,walker);
          lVar5 = lVar5 + 0x20;
        }
        else {
          std::operator<<(s,(string *)((long)&pbVar2[1]._M_dataplus._M_p + lVar5));
          lVar5 = lVar5 + 0x20;
        }
      }
    }
  }
  else {
    ParserWalker::pushOperand(walker,i);
    printBody(walker->point->ct,s,walker);
    walker->point = walker->point->parent;
    walker->depth = walker->depth + -1;
  }
  return;
}

Assistant:

void Constructor::printBody(ostream &s,ParserWalker &walker) const

{
  if (flowthruindex != -1) {
    SubtableSymbol *sym = dynamic_cast<SubtableSymbol *>(operands[flowthruindex]->getDefiningSymbol());
    if (sym != (SubtableSymbol *)0) {
      walker.pushOperand(flowthruindex);
      walker.getConstructor()->printBody(s,walker);
      walker.popOperand();
      return;
    }
  }
  if (firstwhitespace == -1) return; // Nothing to print after firstwhitespace
  for(int4 i=firstwhitespace+1;i<printpiece.size();++i) {
    if (printpiece[i][0]=='\n') {
      int4 index = printpiece[i][1]-'A';
      operands[index]->print(s,walker);
    }
    else
      s << printpiece[i];
  }
}